

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

void __thiscall
testing::internal::
PairMatcherImpl<std::pair<unsigned_int_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>::
PairMatcherImpl<unsigned_int,proto2_unittest::Proto2MapEnumPlusExtra>
          (PairMatcherImpl<std::pair<unsigned_int_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>
           *this,uint first_matcher,Proto2MapEnumPlusExtra second_matcher)

{
  Proto2MapEnumPlusExtra local_20;
  uint local_1c;
  
  *(undefined ***)this = &PTR__PairMatcherImpl_018a6d08;
  local_20 = second_matcher;
  local_1c = first_matcher;
  Matcher<const_unsigned_int_&>::Matcher((Matcher<const_unsigned_int_&> *)(this + 8),&local_1c);
  Matcher<const_proto2_unittest::Proto2MapEnumPlusExtra_&>::Matcher
            ((Matcher<const_proto2_unittest::Proto2MapEnumPlusExtra_&> *)(this + 0x20),&local_20);
  return;
}

Assistant:

PairMatcherImpl(FirstMatcher first_matcher, SecondMatcher second_matcher)
      : first_matcher_(
            testing::SafeMatcherCast<const FirstType&>(first_matcher)),
        second_matcher_(
            testing::SafeMatcherCast<const SecondType&>(second_matcher)) {}